

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

Pos getLinkedGatewayChunk(EndNoise *en,SurfaceNoise *sn,uint64_t seed,Pos src,Pos *dst)

{
  Pos PVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  uint chunkX;
  uint uVar5;
  uint chunkZ;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  undefined1 local_68 [56];
  
  iVar4 = src.x;
  iVar8 = src.z;
  dVar2 = (double)(iVar8 * iVar8 + iVar4 * iVar4);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar11 = (1.0 / dVar2) * (double)iVar4;
  dVar12 = (1.0 / dVar2) * (double)iVar8;
  dVar2 = dVar11 * 1024.0;
  dVar3 = dVar12 * 1024.0;
  local_68._8_4_ = SUB84(dVar3,0);
  local_68._0_8_ = dVar2;
  local_68._12_4_ = (int)((ulong)dVar3 >> 0x20);
  dVar11 = dVar11 * 16.0;
  dVar12 = dVar12 * 16.0;
  dVar2 = floor(dVar2);
  chunkX = (int)dVar2 >> 4;
  dVar2 = floor((double)local_68._8_8_);
  uVar7 = (int)dVar2 >> 4;
  iVar4 = isEndChunkEmpty(en,sn,seed,chunkX,uVar7);
  iVar8 = 0xe;
  if (iVar4 == 0) {
    uVar6 = (ulong)uVar7;
    uVar7 = chunkX;
    do {
      dVar2 = (double)local_68._0_8_ - dVar11;
      dVar3 = (double)local_68._8_8_ - dVar12;
      local_68._8_4_ = SUB84(dVar3,0);
      local_68._0_8_ = dVar2;
      local_68._12_4_ = (int)((ulong)dVar3 >> 0x20);
      dVar2 = floor(dVar2);
      dVar3 = floor((double)local_68._8_8_);
      uVar5 = (int)dVar3 >> 4;
      iVar4 = isEndChunkEmpty(en,sn,seed,(int)dVar2 >> 4,uVar5);
      bVar10 = iVar8 != 0;
      iVar8 = iVar8 + -1;
      chunkX = (int)dVar2 >> 4;
      if (iVar4 != 0) {
        chunkX = uVar7;
      }
    } while ((iVar4 == 0) && (uVar6 = (ulong)uVar5, uVar7 = chunkX, bVar10));
  }
  else {
    do {
      dVar2 = (double)local_68._0_8_ + dVar11;
      dVar3 = (double)local_68._8_8_ + dVar12;
      local_68._8_4_ = SUB84(dVar3,0);
      local_68._0_8_ = dVar2;
      local_68._12_4_ = (int)((ulong)dVar3 >> 0x20);
      dVar2 = floor(dVar2);
      uVar5 = (int)dVar2 >> 4;
      dVar2 = floor((double)local_68._8_8_);
      chunkZ = (int)dVar2 >> 4;
      if ((uVar5 == chunkX) && (chunkZ == uVar7)) {
        bVar10 = false;
      }
      else {
        iVar4 = isEndChunkEmpty(en,sn,seed,uVar5,chunkZ);
        bVar10 = iVar4 == 0;
        chunkX = uVar5;
        uVar7 = chunkZ;
      }
      uVar6 = (ulong)uVar7;
      bVar9 = iVar8 != 0;
      iVar8 = iVar8 + -1;
    } while ((!bVar10) && (bVar9));
  }
  if (dst != (Pos *)0x0) {
    dVar2 = floor((double)local_68._0_8_);
    dVar3 = floor((double)local_68._8_8_);
    PVar1.z = (int)dVar3;
    PVar1.x = (int)dVar2;
    *dst = PVar1;
  }
  return (Pos)((ulong)chunkX | uVar6 << 0x20);
}

Assistant:

Pos getLinkedGatewayChunk(const EndNoise *en, const SurfaceNoise *sn, uint64_t seed,
    Pos src, Pos *dst)
{
    double invr = 1.0 / sqrt(src.x * src.x + src.z * src.z);
    double dx = src.x * invr;
    double dz = src.z * invr;
    double px = dx * 1024;
    double pz = dz * 1024;
    dx *= 16;
    dz *= 16;

    int i;
    Pos c;
    c.x = (int) floor(px) >> 4;
    c.z = (int) floor(pz) >> 4;

    if (isEndChunkEmpty(en, sn, seed, c.x, c.z))
    {   // look forward for the first non-empty chunk
        for (i = 0; i < 15; i++)
        {
            int qx = (int) floor(px += dx) >> 4;
            int qz = (int) floor(pz += dz) >> 4;
            if (qx == c.x && qz == c.z)
                continue;
            c.x = qx;
            c.z = qz;
            if (!isEndChunkEmpty(en, sn, seed, c.x, c.z))
                break;
        }
    }
    else
    {   // look backward for the last non-empty chunk
        for (i = 0; i < 15; i++)
        {
            int qx = (int) floor(px -= dx) >> 4;
            int qz = (int) floor(pz -= dz) >> 4;
            if (isEndChunkEmpty(en, sn, seed, qx, qz))
                break;
            c.x = qx;
            c.z = qz;
        }
    }
    if (dst)
    {
        dst->x = (int) floor(px);
        dst->z = (int) floor(pz);
    }
    return c;
}